

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

int uECC_valid_public_key(uint8_t *public_key,uECC_Curve curve)

{
  uECC_word_t *native;
  char cVar1;
  char num_words;
  cmpresult_t cVar2;
  uECC_word_t uVar3;
  int iVar4;
  uECC_word_t _public [8];
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uECC_word_t auStack_b8 [8];
  uECC_word_t local_78 [4];
  uECC_word_t local_58 [5];
  
  cVar1 = curve->num_bytes;
  uECC_vli_bytesToNative(auStack_b8,public_key,(int)cVar1);
  num_words = curve->num_words;
  native = auStack_b8 + num_words;
  uECC_vli_bytesToNative(native,public_key + cVar1,(int)cVar1);
  uVar3 = uECC_vli_isZero(auStack_b8,num_words * '\x02');
  iVar4 = 0;
  if (uVar3 == 0) {
    cVar2 = uECC_vli_cmp_unsafe(curve->p,auStack_b8,num_words);
    if (cVar2 == '\x01') {
      cVar2 = uECC_vli_cmp_unsafe(curve->p,native,num_words);
      iVar4 = 0;
      if (cVar2 == '\x01') {
        uECC_vli_modSquare_fast(local_58,native,curve);
        (*curve->x_side)(local_78,auStack_b8,curve);
        uVar3 = uECC_vli_equal(local_58,local_78,num_words);
        iVar4 = (int)uVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

int uECC_valid_public_key(const uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
    uECC_vli_bytesToNative(
        _public + curve->num_words, public_key + curve->num_bytes, curve->num_bytes);
#endif
    return uECC_valid_point(_public, curve);
}